

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawData::DeIndexAllBuffers(ImDrawData *this)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  ImDrawList *pIVar4;
  ImDrawVert *pIVar5;
  unsigned_short *__src;
  ImVec2 IVar6;
  ImDrawVert *pIVar7;
  unsigned_short *__dest;
  ulong uVar8;
  ulong uVar9;
  int rhs_size;
  long lVar10;
  uint uVar11;
  int iVar12;
  ImVector<ImDrawVert> new_vtx_buffer;
  undefined8 local_48;
  ImDrawVert *pIStack_40;
  
  local_48 = 0;
  pIStack_40 = (ImDrawVert *)0x0;
  this->TotalIdxCount = 0;
  this->TotalVtxCount = 0;
  if (0 < this->CmdListsCount) {
    lVar10 = 0;
    do {
      pIVar4 = this->CmdLists[lVar10];
      uVar2 = (pIVar4->IdxBuffer).Size;
      if (uVar2 != 0) {
        if (local_48._4_4_ < (int)uVar2) {
          if (local_48._4_4_ == 0) {
            uVar11 = 8;
          }
          else {
            uVar11 = local_48._4_4_ / 2 + local_48._4_4_;
          }
          if ((int)uVar11 <= (int)uVar2) {
            uVar11 = uVar2;
          }
          if (local_48._4_4_ < (int)uVar11) {
            pIVar7 = (ImDrawVert *)ImGui::MemAlloc((long)(int)uVar11 * 0x14);
            if (pIStack_40 != (ImDrawVert *)0x0) {
              memcpy(pIVar7,pIStack_40,(long)(int)local_48 * 0x14);
              ImGui::MemFree(pIStack_40);
            }
            local_48 = (ulong)uVar11 << 0x20;
            pIStack_40 = pIVar7;
          }
        }
        iVar12 = local_48._4_4_;
        if (0 < (pIVar4->IdxBuffer).Size) {
          uVar8 = 0;
          if (0 < (int)uVar2) {
            uVar8 = (ulong)uVar2;
          }
          uVar9 = 0;
          pIVar7 = pIStack_40;
          do {
            uVar1 = (pIVar4->IdxBuffer).Data[uVar9];
            if (((pIVar4->VtxBuffer).Size <= (int)(uint)uVar1) || (uVar8 == uVar9)) {
              __assert_fail("i >= 0 && i < Size",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                            ,0x5c2,"T &ImVector<ImDrawVert>::operator[](int) [T = ImDrawVert]");
            }
            pIVar5 = (pIVar4->VtxBuffer).Data;
            pIVar7->col = pIVar5[uVar1].col;
            pIVar5 = pIVar5 + uVar1;
            IVar6 = pIVar5->uv;
            pIVar7->pos = pIVar5->pos;
            pIVar7->uv = IVar6;
            uVar9 = uVar9 + 1;
            pIVar7 = pIVar7 + 1;
          } while ((long)uVar9 < (long)(pIVar4->IdxBuffer).Size);
        }
        iVar3 = (pIVar4->VtxBuffer).Size;
        (pIVar4->VtxBuffer).Size = uVar2;
        local_48 = CONCAT44((pIVar4->VtxBuffer).Capacity,iVar3);
        (pIVar4->VtxBuffer).Capacity = iVar12;
        pIVar7 = (pIVar4->VtxBuffer).Data;
        (pIVar4->VtxBuffer).Data = pIStack_40;
        iVar12 = (pIVar4->IdxBuffer).Capacity;
        if (iVar12 < 0) {
          iVar12 = iVar12 / 2 + iVar12;
          if (iVar12 < 1) {
            iVar12 = 0;
          }
          __dest = (unsigned_short *)ImGui::MemAlloc((ulong)(uint)(iVar12 * 2));
          __src = (pIVar4->IdxBuffer).Data;
          if (__src != (unsigned_short *)0x0) {
            memcpy(__dest,__src,(long)(pIVar4->IdxBuffer).Size * 2);
            ImGui::MemFree((pIVar4->IdxBuffer).Data);
          }
          (pIVar4->IdxBuffer).Data = __dest;
          (pIVar4->IdxBuffer).Capacity = iVar12;
        }
        (pIVar4->IdxBuffer).Size = 0;
        this->TotalVtxCount = this->TotalVtxCount + (pIVar4->VtxBuffer).Size;
        pIStack_40 = pIVar7;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->CmdListsCount);
  }
  if (pIStack_40 != (ImDrawVert *)0x0) {
    ImGui::MemFree(pIStack_40);
  }
  return;
}

Assistant:

void ImDrawListSplitter::Merge(ImDrawList* draw_list)
{
    // Note that we never use or rely on _Channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_Count <= 1)
        return;

    SetCurrentChannel(draw_list, 0);
    draw_list->_PopUnusedDrawCmd();

    // Calculate our final buffer sizes. Also fix the incorrect IdxOffset values in each command.
    int new_cmd_buffer_count = 0;
    int new_idx_buffer_count = 0;
    ImDrawCmd* last_cmd = (_Count > 0 && draw_list->CmdBuffer.Size > 0) ? &draw_list->CmdBuffer.back() : NULL;
    int idx_offset = last_cmd ? last_cmd->IdxOffset + last_cmd->ElemCount : 0;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];

        // Equivalent of PopUnusedDrawCmd() for this channel's cmdbuffer and except we don't need to test for UserCallback.
        if (ch._CmdBuffer.Size > 0 && ch._CmdBuffer.back().ElemCount == 0)
            ch._CmdBuffer.pop_back();

        if (ch._CmdBuffer.Size > 0 && last_cmd != NULL)
        {
            ImDrawCmd* next_cmd = &ch._CmdBuffer[0];
            if (ImDrawCmd_HeaderCompare(last_cmd, next_cmd) == 0 && last_cmd->UserCallback == NULL && next_cmd->UserCallback == NULL)
            {
                // Merge previous channel last draw command with current channel first draw command if matching.
                last_cmd->ElemCount += next_cmd->ElemCount;
                idx_offset += next_cmd->ElemCount;
                ch._CmdBuffer.erase(ch._CmdBuffer.Data); // FIXME-OPT: Improve for multiple merges.
            }
        }
        if (ch._CmdBuffer.Size > 0)
            last_cmd = &ch._CmdBuffer.back();
        new_cmd_buffer_count += ch._CmdBuffer.Size;
        new_idx_buffer_count += ch._IdxBuffer.Size;
        for (int cmd_n = 0; cmd_n < ch._CmdBuffer.Size; cmd_n++)
        {
            ch._CmdBuffer.Data[cmd_n].IdxOffset = idx_offset;
            idx_offset += ch._CmdBuffer.Data[cmd_n].ElemCount;
        }
    }
    draw_list->CmdBuffer.resize(draw_list->CmdBuffer.Size + new_cmd_buffer_count);
    draw_list->IdxBuffer.resize(draw_list->IdxBuffer.Size + new_idx_buffer_count);

    // Write commands and indices in order (they are fairly small structures, we don't copy vertices only indices)
    ImDrawCmd* cmd_write = draw_list->CmdBuffer.Data + draw_list->CmdBuffer.Size - new_cmd_buffer_count;
    ImDrawIdx* idx_write = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch._CmdBuffer.Size) { memcpy(cmd_write, ch._CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch._IdxBuffer.Size) { memcpy(idx_write, ch._IdxBuffer.Data, sz * sizeof(ImDrawIdx)); idx_write += sz; }
    }
    draw_list->_IdxWritePtr = idx_write;

    // Ensure there's always a non-callback draw command trailing the command-buffer
    if (draw_list->CmdBuffer.Size == 0 || draw_list->CmdBuffer.back().UserCallback != NULL)
        draw_list->AddDrawCmd();

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();

    _Count = 1;
}